

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void addition_suite::add_real_with_real(void)

{
  undefined8 local_1a0;
  type_conflict9 local_198;
  undefined1 local_18b;
  undefined1 local_18a [2];
  longdouble local_188;
  basic_variable<std::allocator<char>_> local_178;
  undefined1 local_148 [8];
  basic_variable<std::allocator<char>_> data_2;
  type_conflict9 local_110;
  undefined1 local_103;
  undefined1 local_102 [2];
  double local_100;
  basic_variable<std::allocator<char>_> local_f8;
  undefined1 local_c8 [8];
  basic_variable<std::allocator<char>_> data_1;
  undefined8 local_90;
  type_conflict9 local_88;
  undefined1 local_7f;
  undefined1 local_7e [18];
  float local_6c;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  basic_variable<std::allocator<char>_> data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_68,3.0);
  local_6c = 3.0;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_38,&local_68,&local_6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  local_7e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_7f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9ea,"void addition_suite::add_real_with_real()",local_7e,&local_7f);
  local_88 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_90 = 0x4018000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","6.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9eb,"void addition_suite::add_real_with_real()",&local_88,&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_f8,3.0);
  local_100 = 3.0;
  trial::dynamic::operator+((basic_variable<std::allocator<char>_> *)local_c8,&local_f8,&local_100);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f8);
  local_102[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_c8);
  local_103 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9ef,"void addition_suite::add_real_with_real()",local_102,&local_103);
  local_110 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_c8);
  data_2.storage._40_8_ = 0x4018000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","6.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9f0,"void addition_suite::add_real_with_real()",&local_110,
             &data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_178,3.0);
  local_188 = (longdouble)3.0;
  trial::dynamic::operator+
            ((basic_variable<std::allocator<char>_> *)local_148,&local_178,&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_178);
  local_18a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_148);
  local_18b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9f4,"void addition_suite::add_real_with_real()",local_18a,&local_18b);
  local_198 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_148);
  local_1a0 = 0x4018000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","6.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x9f5,"void addition_suite::add_real_with_real()",&local_198,&local_1a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_148);
  return;
}

Assistant:

void add_real_with_real()
{
    {
        auto data = variable(3.0) + 3.0f;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 6.0);
    }
    {
        auto data = variable(3.0) + 3.0;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 6.0);
    }
    {
        auto data = variable(3.0) + 3.0L;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 6.0);
    }
}